

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_pcm.cpp
# Opt level: O3

void __thiscall ymfm::pcm_channel::load_wavetable(pcm_channel *this)

{
  size_t in_RCX;
  
  this->m_format = '\0';
  this->m_baseaddr = 0;
  this->m_endpos = 0;
  this->m_looppos = 0;
  pcm_engine::write(this->m_owner,this->m_choffs + 0x80,(void *)0x0,in_RCX);
  pcm_engine::write(this->m_owner,this->m_choffs + 0x98,(void *)0x0,in_RCX);
  pcm_engine::write(this->m_owner,this->m_choffs + 0xb0,(void *)0x0,in_RCX);
  pcm_engine::write(this->m_owner,this->m_choffs + 200,(void *)0x0,in_RCX);
  pcm_engine::write(this->m_owner,this->m_choffs + 0xe0,(void *)0x0,in_RCX);
  this->m_env_attenuation = 0x3ff;
  return;
}

Assistant:

void pcm_channel::load_wavetable()
{
	// determine the address of the wave table header
	uint32_t wavnum = m_regs.ch_wave_table_num(m_choffs);
	uint32_t wavheader = 12 * wavnum;

	// above 384 it may be in a different bank
	if (wavnum >= 384)
	{
		uint32_t bank = m_regs.wave_table_header();
		if (bank != 0)
			wavheader = 512*1024 * bank + (wavnum - 384) * 12;
	}

	// fetch the 22-bit base address and 2-bit format
	uint8_t byte = read_pcm(wavheader + 0);
	m_format = bitfield(byte, 6, 2);
	m_baseaddr = bitfield(byte, 0, 6) << 16;
	m_baseaddr |= read_pcm(wavheader + 1) << 8;
	m_baseaddr |= read_pcm(wavheader + 2) << 0;

	// fetch the 16-bit loop position
	m_looppos = read_pcm(wavheader + 3) << 8;
	m_looppos |= read_pcm(wavheader + 4);
	m_looppos <<= 16;

	// fetch the 16-bit end position, which is stored as a negative value
	// for some reason that is unclear
	m_endpos = read_pcm(wavheader + 5) << 8;
	m_endpos |= read_pcm(wavheader + 6);
	m_endpos = -int32_t(m_endpos) << 16;

	// remaining data values set registers
	m_owner.write(0x80 + m_choffs, read_pcm(wavheader + 7));
	m_owner.write(0x98 + m_choffs, read_pcm(wavheader + 8));
	m_owner.write(0xb0 + m_choffs, read_pcm(wavheader + 9));
	m_owner.write(0xc8 + m_choffs, read_pcm(wavheader + 10));
	m_owner.write(0xe0 + m_choffs, read_pcm(wavheader + 11));

	// reset the envelope so we don't continue playing mid-sample from previous key ons
	m_env_attenuation = 0x3ff;
}